

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

timeval tvnow(void)

{
  timeval tVar1;
  int iVar2;
  timeval now;
  timespec tsnow;
  timeval local_20;
  timespec local_10;
  
  iVar2 = clock_gettime(1,&local_10);
  if (iVar2 == 0) {
    local_20.tv_sec = local_10.tv_sec;
    local_20.tv_usec = local_10.tv_nsec / 1000;
  }
  else {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  }
  tVar1.tv_usec = local_20.tv_usec;
  tVar1.tv_sec = local_20.tv_sec;
  return tVar1;
}

Assistant:

static struct timeval tvnow(void)
{
  /*
  ** clock_gettime() is granted to be increased monotonically when the
  ** monotonic clock is queried. Time starting point is unspecified, it
  ** could be the system start-up time, the Epoch, or something else,
  ** in any case the time starting point does not change once that the
  ** system has started up.
  */
  struct timeval now;
  struct timespec tsnow;
  if(0 == clock_gettime(CLOCK_MONOTONIC, &tsnow)) {
    now.tv_sec = tsnow.tv_sec;
    now.tv_usec = tsnow.tv_nsec / 1000;
  }
  /*
  ** Even when the configure process has truly detected monotonic clock
  ** availability, it might happen that it is not actually available at
  ** run-time. When this occurs simply fallback to other time source.
  */
#ifdef HAVE_GETTIMEOFDAY
  else
    (void)gettimeofday(&now, NULL);
#else
  else {
    now.tv_sec = (long)time(NULL);
    now.tv_usec = 0;
  }
#endif
  return now;
}